

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cpp
# Opt level: O3

vector<field::GF2E,_std::allocator<field::GF2E>_> *
field::interpolate_with_precomputation
          (vector<field::GF2E,_std::allocator<field::GF2E>_> *__return_storage_ptr__,
          vector<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
          *precomputed_lagrange_polynomials,
          vector<field::GF2E,_std::allocator<field::GF2E>_> *y_values)

{
  pointer pvVar1;
  long lVar2;
  runtime_error *this;
  long lVar3;
  long lVar4;
  vector<field::GF2E,_std::allocator<field::GF2E>_> *res;
  vector<field::GF2E,_std::allocator<field::GF2E>_> local_48;
  
  lVar2 = (long)(y_values->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(y_values->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar2 != 0) {
    pvVar1 = (precomputed_lagrange_polynomials->
             super__Vector_base<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (((long)(precomputed_lagrange_polynomials->
               super__Vector_base<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
        -0x5555555555555555 - (lVar2 >> 3) == 0) {
      std::vector<field::GF2E,_std::allocator<field::GF2E>_>::vector
                (__return_storage_ptr__,
                 (long)*(pointer *)
                        ((long)&(pvVar1->
                                super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                                _M_impl.super__Vector_impl_data + 8) -
                 *(long *)&(pvVar1->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                           _M_impl.super__Vector_impl_data >> 3,(allocator_type *)&local_48);
      lVar2 = (long)(y_values->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(y_values->super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                    _M_impl.super__Vector_impl_data._M_start;
      if (lVar2 != 0) {
        lVar2 = lVar2 >> 3;
        lVar2 = lVar2 + (ulong)(lVar2 == 0);
        lVar4 = 0;
        lVar3 = 0;
        do {
          operator*(&local_48,
                    (vector<field::GF2E,_std::allocator<field::GF2E>_> *)
                    ((long)&(((precomputed_lagrange_polynomials->
                              super__Vector_base<std::vector<field::GF2E,_std::allocator<field::GF2E>_>,_std::allocator<std::vector<field::GF2E,_std::allocator<field::GF2E>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->
                            super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>)._M_impl.
                            super__Vector_impl_data + lVar3),
                    (GF2E *)((long)&((y_values->
                                     super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>).
                                     _M_impl.super__Vector_impl_data._M_start)->data + lVar4));
          operator+=(__return_storage_ptr__,&local_48);
          if (local_48.super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.
                                  super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.
                                  super__Vector_base<field::GF2E,_std::allocator<field::GF2E>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar3 = lVar3 + 0x18;
          lVar4 = lVar4 + 8;
          lVar2 = lVar2 + -1;
        } while (lVar2 != 0);
      }
      return __return_storage_ptr__;
    }
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"invalid sizes for interpolation");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<GF2E> interpolate_with_precomputation(
    const std::vector<std::vector<GF2E>> &precomputed_lagrange_polynomials,
    const std::vector<GF2E> &y_values) {
  if (precomputed_lagrange_polynomials.size() != y_values.size() ||
      y_values.empty())
    throw std::runtime_error("invalid sizes for interpolation");

  std::vector<GF2E> res(precomputed_lagrange_polynomials[0].size());
  size_t m = y_values.size();
  for (size_t k = 0; k < m; k++) {
    res += precomputed_lagrange_polynomials[k] * y_values[k];
  }
  return res;
}